

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O1

void __thiscall
charls::jls_codec<charls::default_traits<unsigned_short,_unsigned_short>,_charls::encoder_strategy>
::encode_lines(jls_codec<charls::default_traits<unsigned_short,_unsigned_short>,_charls::encoder_strategy>
               *this)

{
  process_line *ppVar1;
  pixel_type *ppVar2;
  ulong uVar3;
  unsigned_short *__tmp;
  long lVar4;
  uint uVar5;
  size_type sVar6;
  size_type __n;
  vector<int,_std::allocator<int>_> run_index;
  vector<unsigned_short,_std::allocator<unsigned_short>_> line_buffer;
  allocator_type local_71;
  ulong local_70;
  int local_64;
  vector<int,_std::allocator<int>_> local_60;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_48;
  
  local_70 = (ulong)(this->width_ + 4);
  local_64 = 1;
  if ((this->super_encoder_strategy).parameters_.interleave_mode == Line) {
    local_64 = (this->super_encoder_strategy).frame_info_.component_count;
  }
  __n = (size_type)local_64;
  lVar4 = __n * local_70;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            (&local_48,lVar4 * 2,(allocator_type *)&local_60);
  std::vector<int,_std::allocator<int>_>::vector(&local_60,__n,&local_71);
  uVar3 = local_70;
  if ((this->super_encoder_strategy).frame_info_.height != 0) {
    uVar5 = 0;
    do {
      this->previous_line_ =
           local_48.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start + 1;
      this->current_line_ =
           local_48.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start + lVar4 + 1;
      if ((uVar5 & 1) != 0) {
        this->previous_line_ =
             local_48.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start + lVar4 + 1;
        this->current_line_ =
             local_48.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start + 1;
      }
      ppVar1 = (this->super_encoder_strategy).process_line_._M_t.
               super___uniq_ptr_impl<charls::process_line,_std::default_delete<charls::process_line>_>
               ._M_t.
               super__Tuple_impl<0UL,_charls::process_line_*,_std::default_delete<charls::process_line>_>
               .super__Head_base<0UL,_charls::process_line_*,_false>._M_head_impl;
      (*ppVar1->_vptr_process_line[3])(ppVar1,this->current_line_,(ulong)this->width_,local_70);
      if (local_64 != 0) {
        sVar6 = 0;
        do {
          this->run_index_ =
               local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[sVar6];
          ppVar2 = this->previous_line_;
          ppVar2[this->width_] = ppVar2[this->width_ - 1];
          this->current_line_[-1] = *ppVar2;
          do_line(this,(sample_type *)0x0);
          local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[sVar6] = this->run_index_;
          this->previous_line_ = this->previous_line_ + uVar3;
          this->current_line_ = this->current_line_ + uVar3;
          sVar6 = sVar6 + 1;
        } while (__n != sVar6);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < (this->super_encoder_strategy).frame_info_.height);
  }
  encoder_strategy::end_scan(&this->super_encoder_strategy);
  if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void encode_lines()
    {
        const uint32_t pixel_stride{width_ + 4U};
        const size_t component_count{
            parameters().interleave_mode == interleave_mode::line ? static_cast<size_t>(frame_info().component_count) : 1U};

        std::vector<pixel_type> line_buffer(component_count * pixel_stride * 2);
        std::vector<int32_t> run_index(component_count);

        for (uint32_t line{}; line < frame_info().height; ++line)
        {
            previous_line_ = &line_buffer[1];
            current_line_ = &line_buffer[1 + static_cast<size_t>(component_count) * pixel_stride];
            if ((line & 1) == 1)
            {
                std::swap(previous_line_, current_line_);
            }

            Strategy::on_line_begin(current_line_, width_, pixel_stride);

            for (size_t component{}; component < component_count; ++component)
            {
                run_index_ = run_index[component];

                // initialize edge pixels used for prediction
                previous_line_[width_] = previous_line_[width_ - 1];
                current_line_[-1] = previous_line_[0];
                do_line(static_cast<pixel_type*>(nullptr)); // dummy argument for overload resolution

                run_index[component] = run_index_;
                previous_line_ += pixel_stride;
                current_line_ += pixel_stride;
            }
        }

        Strategy::end_scan();
    }